

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZFrontMatrix.cpp
# Opt level: O1

void __thiscall
TPZFrontMatrix<long_double,_TPZStackEqnStorage<long_double>,_TPZFrontSym<long_double>_>::
TPZFrontMatrix(TPZFrontMatrix<long_double,_TPZStackEqnStorage<long_double>,_TPZFrontSym<long_double>_>
               *this,void **vtt)

{
  *(undefined8 *)
   ((long)&(this->super_TPZAbstractFrontMatrix<long_double>).super_TPZMatrix<long_double>.
           super_TPZBaseMatrix.fRow + 2) = 0;
  *(undefined8 *)
   ((long)&(this->super_TPZAbstractFrontMatrix<long_double>).super_TPZMatrix<long_double>.
           super_TPZBaseMatrix.fCol + 2) = 0;
  (this->super_TPZAbstractFrontMatrix<long_double>).super_TPZMatrix<long_double>.super_TPZBaseMatrix
  .super_TPZSavable._vptr_TPZSavable = (_func_int **)0x0;
  (this->super_TPZAbstractFrontMatrix<long_double>).super_TPZMatrix<long_double>.super_TPZBaseMatrix
  .fRow = 0;
  (this->super_TPZAbstractFrontMatrix<long_double>).super_TPZMatrix<long_double>.super_TPZBaseMatrix
  .super_TPZSavable._vptr_TPZSavable = (_func_int **)vtt[4];
  (this->super_TPZAbstractFrontMatrix<long_double>).super_TPZMatrix<long_double>.super_TPZBaseMatrix
  .super_TPZSavable._vptr_TPZSavable = (_func_int **)vtt[3];
  (this->super_TPZAbstractFrontMatrix<long_double>).super_TPZMatrix<long_double>.super_TPZBaseMatrix
  .fRow = 0;
  (this->super_TPZAbstractFrontMatrix<long_double>).super_TPZMatrix<long_double>.super_TPZBaseMatrix
  .fCol = 0;
  (this->super_TPZAbstractFrontMatrix<long_double>).super_TPZMatrix<long_double>.super_TPZBaseMatrix
  .fDecomposed = '\0';
  (this->super_TPZAbstractFrontMatrix<long_double>).super_TPZMatrix<long_double>.super_TPZBaseMatrix
  .fDefPositive = '\0';
  (this->super_TPZAbstractFrontMatrix<long_double>).super_TPZMatrix<long_double>.super_TPZBaseMatrix
  .super_TPZSavable._vptr_TPZSavable = (_func_int **)vtt[2];
  (this->super_TPZAbstractFrontMatrix<long_double>).super_TPZMatrix<long_double>.super_TPZBaseMatrix
  .super_TPZSavable._vptr_TPZSavable = (_func_int **)vtt[1];
  (this->super_TPZAbstractFrontMatrix<long_double>).super_TPZMatrix<long_double>.super_TPZBaseMatrix
  .super_TPZSavable._vptr_TPZSavable = (_func_int **)*vtt;
  TPZStackEqnStorage<long_double>::TPZStackEqnStorage(&this->fStorage);
  TPZFrontSym<long_double>::TPZFrontSym(&this->fFront);
  (this->fNumElConnected)._vptr_TPZVec = (_func_int **)&PTR__TPZVec_0183b5b0;
  (this->fNumElConnected).fStore = (int *)0x0;
  (this->fNumElConnected).fNElements = 0;
  (this->fNumElConnected).fNAlloc = 0;
  (this->fNumElConnectedBackup)._vptr_TPZVec = (_func_int **)&PTR__TPZVec_0183b5b0;
  (this->fNumElConnectedBackup).fStore = (int *)0x0;
  (this->fNumElConnectedBackup).fNElements = 0;
  (this->fNumElConnectedBackup).fNAlloc = 0;
  TPZFrontSym<long_double>::Reset(&this->fFront,0);
  TPZStackEqnStorage<long_double>::Reset(&this->fStorage);
  TPZVec<int>::Resize(&this->fNumElConnected,0);
  TPZVec<int>::Resize(&this->fNumElConnectedBackup,0);
  this->fLastDecomposed = -1;
  this->fNumEq = 0;
  return;
}

Assistant:

TPZFrontMatrix<TVar,store, front>::TPZFrontMatrix() : TPZRegisterClassId(&TPZFrontMatrix::ClassId),
TPZAbstractFrontMatrix<TVar>()
{
	fFront.Reset();
	fStorage.Reset();
	fNumElConnected.Resize(0);
	fNumElConnectedBackup.Resize(0);
	fLastDecomposed = -1;
	fNumEq=0;
}